

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QPersistentModelIndex>::QList(QList<QPersistentModelIndex> *this,qsizetype size)

{
  QArrayDataPointer<QPersistentModelIndex>::QArrayDataPointer(&this->d,size,0,KeepSize);
  if (size != 0) {
    QArrayDataPointer<QPersistentModelIndex>::appendInitialize(&this->d,size);
    return;
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }